

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gchtfind.c
# Opt level: O1

LispPTR htfind(LispPTR ptr,int casep)

{
  uint *puVar1;
  LispPTR LVar2;
  bool bVar3;
  ulong uVar4;
  uint *extraout_RAX;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  LispPTR *pLVar8;
  uint uVar9;
  
  uVar7 = ptr >> 0xf & 0x1ffe;
  puVar1 = (uint *)((long)HTmain + (ulong)(ptr & 0xfffe) * 2);
  uVar9 = *puVar1;
  if (uVar9 == 0) {
    if (casep == 1) {
      *puVar1 = uVar7;
LAB_00124115:
      uVar9 = *Reclaim_cnt_word - 1;
      *Reclaim_cnt_word = uVar9;
    }
    else {
      if (casep != 0) {
LAB_00124427:
        error("GC error: new entry touches stack bit");
        goto LAB_00124433;
      }
      *puVar1 = uVar7 | 0x40000;
      uVar9 = *Reclaim_cnt_word - 1;
      *Reclaim_cnt_word = uVar9;
      ptr = 0;
    }
    if (uVar9 < 0xe0001) {
      MachineState.irqcheck = 0;
      MachineState.irqend = 0;
      *Reclaim_cnt_word = 0xe0000;
    }
  }
  else {
    if ((uVar9 & 1) == 0) {
      if (uVar7 == (uVar9 & 0x1ffe)) {
        puVar5 = puVar1;
        if (0xfffdffff < uVar9) goto LAB_00124106;
        if (casep == 1) {
          if (uVar9 < 0x20000) {
            error("attempt to decrement 0 reference count");
          }
          uVar9 = uVar9 - 0x20000;
LAB_0012431b:
          if ((uVar9 & 0xffff0000) == 0x20000) {
            *Reclaim_cnt_word = *Reclaim_cnt_word + 1;
            *puVar1 = 0;
            goto LAB_00124433;
          }
        }
        else {
          if (casep == 0) {
            uVar9 = uVar9 + 0x20000;
            if (0xfffdffff < uVar9) {
              *puVar1 = uVar9;
              goto LAB_001241b9;
            }
            goto LAB_0012431b;
          }
          error("GC error: mod entry touches stack bit");
        }
        *puVar1 = uVar9;
      }
      else {
        uVar4 = (ulong)*HTcoll;
        if (uVar4 == 0) {
          uVar4 = (ulong)HTcoll[1];
          if (uVar4 < 0x7fff0) {
            HTcoll[1] = HTcoll[1] + 2;
            goto LAB_0012429f;
          }
          bVar3 = false;
          pLVar8 = (LispPTR *)(ulong)(uint)casep;
          disablegc1(0);
        }
        else {
          *HTcoll = HTcoll[uVar4 + 1];
LAB_0012429f:
          pLVar8 = HTcoll + uVar4;
          bVar3 = true;
        }
        if (bVar3) {
          uVar4 = (ulong)*HTcoll;
          if (uVar4 == 0) {
            uVar4 = (ulong)HTcoll[1];
            if (uVar4 < 0x7fff0) {
              HTcoll[1] = HTcoll[1] + 2;
              goto LAB_001243b4;
            }
            bVar3 = false;
            disablegc1(0);
            puVar5 = extraout_RAX;
          }
          else {
            *HTcoll = HTcoll[uVar4 + 1];
LAB_001243b4:
            puVar5 = HTcoll + uVar4;
            bVar3 = true;
          }
          if (bVar3) {
            puVar5[1] = 0;
            *puVar5 = uVar9;
            pLVar8[1] = (LispPTR)((ulong)((long)puVar5 - (long)HTcoll) >> 2);
            *puVar1 = (int)((ulong)((long)pLVar8 - (long)HTcoll) >> 2) + 1;
            if (casep == 1) {
              *pLVar8 = uVar7;
              goto LAB_00124115;
            }
            if (casep != 0) goto LAB_00124427;
            *pLVar8 = uVar7 | 0x40000;
LAB_001243f6:
            LVar2 = *Reclaim_cnt_word;
            *Reclaim_cnt_word = LVar2 - 1;
            if (LVar2 - 1 < 0xe0001) {
              MachineState.irqcheck = 0;
              MachineState.irqend = 0;
              *Reclaim_cnt_word = 0xe0000;
            }
          }
        }
      }
    }
    else {
      puVar5 = HTcoll + (uVar9 - 1);
      uVar9 = *puVar5;
      if (uVar7 == (uVar9 & 0x1ffe)) {
        puVar6 = (uint *)0x0;
      }
      else {
        do {
          puVar6 = puVar5;
          if ((ulong)puVar6[1] == 0) {
            uVar4 = (ulong)*HTcoll;
            if (uVar4 == 0) {
              uVar4 = (ulong)HTcoll[1];
              if (uVar4 < 0x7fff0) {
                HTcoll[1] = HTcoll[1] + 2;
                goto LAB_00124365;
              }
              bVar3 = false;
              disablegc1(0);
            }
            else {
              *HTcoll = HTcoll[uVar4 + 1];
LAB_00124365:
              puVar6 = HTcoll + uVar4;
              bVar3 = true;
            }
            if (!bVar3) goto LAB_00124433;
            puVar6[1] = *puVar1 - 1;
            *puVar1 = (int)((ulong)((long)puVar6 - (long)HTcoll) >> 2) + 1;
            if (casep == 1) {
              *puVar6 = uVar7;
              goto LAB_00124115;
            }
            if (casep != 0) goto LAB_00124427;
            *puVar6 = uVar7 | 0x40000;
            goto LAB_001243f6;
          }
          puVar5 = HTcoll + puVar6[1];
          uVar9 = *puVar5;
        } while (uVar7 != (uVar9 & 0x1ffe));
      }
      if (0xfffdffff < uVar9) {
LAB_00124106:
        modify_big_reference_count(puVar5,(DLword)casep,ptr);
        goto LAB_00124433;
      }
      if (casep == 1) {
        if (uVar9 < 0x20000) {
          error("attempt to decrement 0 reference count");
        }
        uVar9 = uVar9 - 0x20000;
LAB_0012421f:
        if ((uVar9 & 0xffff0000) == 0x20000) {
          *Reclaim_cnt_word = *Reclaim_cnt_word + 1;
          if (puVar6 == (uint *)0x0) {
            *puVar1 = puVar5[1] | 1;
          }
          else {
            puVar6[1] = puVar5[1];
          }
          *puVar5 = 0;
          puVar5[1] = *HTcoll;
          *HTcoll = (LispPTR)((ulong)((long)puVar5 - (long)HTcoll) >> 2);
          if (HTcoll[*puVar1] != 0) {
            return 0;
          }
          pLVar8 = HTcoll + *puVar1;
          *puVar1 = pLVar8[-1];
          pLVar8[-1] = 0;
          *pLVar8 = *HTcoll;
          *HTcoll = (LispPTR)((ulong)((long)pLVar8 + (-4 - (long)HTcoll)) >> 2);
          return 0;
        }
      }
      else {
        if (casep == 0) {
          uVar9 = uVar9 + 0x20000;
          if (0xfffdffff < uVar9) {
            *puVar5 = uVar9;
LAB_001241b9:
            enter_big_reference_count(ptr);
            goto LAB_00124433;
          }
          goto LAB_0012421f;
        }
        error("GC error: mod entry touches stack bit");
      }
      *puVar5 = uVar9;
    }
LAB_00124433:
    ptr = 0;
  }
  return ptr;
}

Assistant:

LispPTR htfind(LispPTR ptr, int casep) {
  GCENTRY *entry, *link, *prev;
  GCENTRY entry_contents, hiptr;

  /* if the NOREF bit is on in the type table entry, do
  not reference count this pointer. Used for non-reference
  counted types like symbols, and also when the GC is
  disabled. */

  /*
   * Following two tests were moved into GCLOOKUP macro
   * for efficiency.
   */
  /*
      if (GetTypeEntry(ptr) & TT_NOREF) return NIL;
  */
  /* if *GcDisabled_word is T then do nothing */
  /* FS:  this test should not be needed (because type table should
          be cleared).  Also, this test seems to cause an infinite
          ucode loop in remimplicitkeyhash on the 386i		*/

  /*    if(*GcDisabled_word == ATOM_T) return(NIL); */

  /* GC hash table entries have the high 8 bits of the
  pointer stored in the middle. Set up hiptr to have
  the high bits of the pointer ready to store or test
  against */

  hiptr = (((UNSIGNED)ptr) >> (16 - HTHISHIFT)) & HTHIMASK;

  /* entry points at the place in the main hash table
  where this pointer is stored. The 'hash' isn't one really;
  it just uses the low bits of the pointer. */

  entry = HTmain + (LOLOC(ptr) >> 1);

  entry_contents = GETGC(entry);

  if (entry_contents == 0) NewEntry(entry, hiptr, casep, ptr);
  /* NewEntry returns */

  if (entry_contents & 1) { /* low bit means a collision entry */
    /* entry_contents-1 removes low bit */
    link = HTcoll + (entry_contents - 1);
    prev = 0;
    goto newlink;
  }

  if (hiptr == (entry_contents & HTHIMASK)) {
    ModEntry(entry, entry_contents, ptr, casep, delentry);
    /* ModEntry returns or will go to delentry */
  }

  /* new collision */

  GetLink(link);
  GetLink(prev);
  GETGC((GCENTRY *)prev + 1) = 0;
  GETGC((GCENTRY *)prev) = entry_contents;
  GETGC((GCENTRY *)link + 1) = prev - HTcoll;
  GETGC((GCENTRY *)entry) = (link - HTcoll) + 1;

  NewEntry(link, hiptr, casep, ptr);
/* NewEntry returns */

delentry:
  GETGC(entry) = 0;
  return NIL;

/* start here when a collision is detected. link is a pointer to
  the entry in the collision table, prev is the previous collision
  entry or 0 if this is the first one. */

newlink:
  entry_contents = GETGC(link);
  if (hiptr == (entry_contents & HTHIMASK)) {
    ModEntry(link, entry_contents, ptr, casep, dellink);
    /* ModEntry returns or goes to dellink */
  }

  /* collision didn't match  */
  entry_contents = GETGC((GCENTRY *)link + 1);
  if (entry_contents == 0) goto nolink;

  /* try the next link in the collision table */
  prev = link;
  link = HTcoll + entry_contents;
  goto newlink;

dellink:
  if (prev)
    GETGC((GCENTRY *)prev + 1) = GETGC((GCENTRY *)link + 1);
  else
    GETGC((GCENTRY *)entry) = (GETGC((GCENTRY *)link + 1)) | 1;
  FreeLink(link);
  link = HTcoll + (GETGC((GCENTRY *)entry)) - 1;
  if (GETGC(link + 1) == 0) {
    GETGC((GCENTRY *)entry) = GETGC((GCENTRY *)link);
    FreeLink(link);
  }
  return NIL;

nolink: /* no match */

  GetLink(link);
  GETGC((GCENTRY *)link + 1) = GETGC((GCENTRY *)entry) - 1;
  GETGC((GCENTRY *)entry) = (link - HTcoll) + 1;
  NewEntry(link, hiptr, casep, ptr);
  /* NewEntry will return */
}